

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O1

float __thiscall irr::CIrrDeviceSDL::getDisplayDensity(CIrrDeviceSDL *this)

{
  long lVar1;
  float fVar2;
  float fVar5;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int drawable_h;
  int drawable_w;
  int window_h;
  int window_w;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  lVar1 = *(long *)&(this->super_CIrrDeviceStub).field_0xf8;
  if (lVar1 == 0) {
    fVar5 = 0.0;
  }
  else {
    SDL_GetWindowSize(lVar1,&local_24,&local_28);
    SDL_GL_GetDrawableSize
              (*(undefined8 *)&(this->super_CIrrDeviceStub).field_0xf8,&local_2c,&local_30);
    auVar3._0_4_ = (float)local_2c;
    auVar3._4_4_ = (float)local_30;
    auVar3._8_8_ = 0;
    auVar4._4_4_ = (float)local_28;
    auVar4._0_4_ = (float)local_24;
    auVar4._8_8_ = 0;
    auVar4 = divps(auVar3,auVar4);
    fVar2 = auVar4._0_4_ * 96.0;
    fVar5 = auVar4._4_4_ * 96.0;
    if (fVar5 <= fVar2) {
      fVar5 = fVar2;
    }
  }
  return fVar5;
}

Assistant:

float CIrrDeviceSDL::getDisplayDensity() const
{
	if (!Window)
		return 0.0f;

	int window_w;
	int window_h;
	SDL_GetWindowSize(Window, &window_w, &window_h);

	int drawable_w;
	int drawable_h;
	SDL_GL_GetDrawableSize(Window, &drawable_w, &drawable_h);

	// assume 96 dpi
	float dpi_w = (float)drawable_w / (float)window_w * 96.0f;
	float dpi_h = (float)drawable_h / (float)window_h * 96.0f;

	return std::max(dpi_w, dpi_h);
}